

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall
vera::Image::Image(Image *this,uint8_t *_array3D,int _height,int _width,int _channels)

{
  allocator local_25;
  uint local_24;
  uint local_20;
  int _channels_local;
  int _width_local;
  int _height_local;
  uint8_t *_array3D_local;
  Image *this_local;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_0076ca98;
  local_24 = _channels;
  local_20 = _width;
  _channels_local = _height;
  __width_local = _array3D;
  _array3D_local = (uint8_t *)this;
  std::__cxx11::string::string((string *)&this->name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_path,"",&local_25);
  std::allocator<char>::~allocator((allocator<char> *)&local_25);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_data);
  (*this->_vptr_Image[0x10])
            (this,__width_local,(ulong)(uint)_channels_local,(ulong)local_20,(ulong)local_24);
  return;
}

Assistant:

Image::Image(const uint8_t* _array3D, int _height, int _width, int _channels): m_path("") {
    set(_array3D, _height, _width, _channels);
}